

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sort_key_helpers.hpp
# Opt level: O2

void duckdb::AggregateSortKeyHelpers::
     UnaryUpdate<duckdb::QuantileState<duckdb::string_t,duckdb::QuantileStringType>,duckdb::QuantileListFallback,(duckdb::OrderType)2,true>
               (Vector *inputs,AggregateInputData *input_data,idx_t input_count,Vector *state_vector
               ,idx_t count)

{
  ulong uVar1;
  ulong uVar2;
  idx_t i;
  ulong uVar3;
  LogicalType local_180 [24];
  UnifiedVectorFormat sdata;
  long local_160;
  UnifiedVectorFormat kdata;
  long local_118;
  UnifiedVectorFormat idata;
  long local_c8;
  Vector sort_key;
  
  duckdb::LogicalType::LogicalType(local_180,BLOB);
  duckdb::Vector::Vector(&sort_key,local_180,0x800);
  duckdb::LogicalType::~LogicalType(local_180);
  duckdb::CreateSortKeyHelpers::CreateSortKey(inputs,count,(OrderModifiers)0x302,&sort_key);
  duckdb::UnifiedVectorFormat::UnifiedVectorFormat(&idata);
  duckdb::Vector::ToUnifiedFormat((ulong)inputs,(UnifiedVectorFormat *)count);
  duckdb::UnifiedVectorFormat::UnifiedVectorFormat(&kdata);
  duckdb::Vector::ToUnifiedFormat((ulong)&sort_key,(UnifiedVectorFormat *)count);
  duckdb::UnifiedVectorFormat::UnifiedVectorFormat(&sdata);
  duckdb::Vector::ToUnifiedFormat((ulong)state_vector,(UnifiedVectorFormat *)count);
  for (uVar3 = 0; count != uVar3; uVar3 = uVar3 + 1) {
    uVar1 = uVar3;
    if (*_sdata != 0) {
      uVar1 = (ulong)*(uint *)(*_sdata + uVar3 * 4);
    }
    uVar2 = uVar3;
    if (*_idata != 0) {
      uVar2 = (ulong)*(uint *)(*_idata + uVar3 * 4);
    }
    if ((local_c8 == 0) || ((*(ulong *)(local_c8 + (uVar2 >> 6) * 8) >> (uVar2 & 0x3f) & 1) != 0)) {
      uVar2 = uVar3;
      if (*_kdata != 0) {
        uVar2 = (ulong)*(uint *)(*_kdata + uVar3 * 4);
      }
      QuantileListFallback::
      Execute<duckdb::string_t,duckdb::QuantileState<duckdb::string_t,duckdb::QuantileStringType>,duckdb::QuantileListFallback>
                (*(QuantileState<duckdb::string_t,_duckdb::QuantileStringType> **)
                  (local_160 + uVar1 * 8),(string_t *)(uVar2 * 0x10 + local_118),input_data);
    }
  }
  UnifiedVectorFormat::~UnifiedVectorFormat(&sdata);
  UnifiedVectorFormat::~UnifiedVectorFormat(&kdata);
  UnifiedVectorFormat::~UnifiedVectorFormat(&idata);
  Vector::~Vector(&sort_key);
  return;
}

Assistant:

static void UnaryUpdate(Vector inputs[], AggregateInputData &input_data, idx_t input_count, Vector &state_vector,
	                        idx_t count) {
		D_ASSERT(input_count == 1);
		auto &input = inputs[0];

		Vector sort_key(LogicalType::BLOB);
		auto modifiers = OrderModifiers(ORDER_TYPE, OrderByNullType::NULLS_LAST);
		CreateSortKeyHelpers::CreateSortKey(input, count, modifiers, sort_key);

		UnifiedVectorFormat idata;
		if (IGNORE_NULLS) {
			input.ToUnifiedFormat(count, idata);
		}

		UnifiedVectorFormat kdata;
		sort_key.ToUnifiedFormat(count, kdata);

		UnifiedVectorFormat sdata;
		state_vector.ToUnifiedFormat(count, sdata);

		auto key_data = UnifiedVectorFormat::GetData<string_t>(kdata);
		auto states = UnifiedVectorFormat::GetData<STATE *>(sdata);
		for (idx_t i = 0; i < count; i++) {
			const auto sidx = sdata.sel->get_index(i);
			if (IGNORE_NULLS) {
				auto idx = idata.sel->get_index(i);
				if (!idata.validity.RowIsValid(idx)) {
					continue;
				}
			}
			const auto key_idx = kdata.sel->get_index(i);
			auto &state = *states[sidx];
			OP::template Execute<string_t, STATE, OP>(state, key_data[key_idx], input_data);
		}
	}